

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<4,_1048576,_false,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 (*pauVar39) [16];
  byte bVar40;
  undefined4 uVar41;
  ulong *puVar42;
  long lVar43;
  undefined4 uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  undefined1 (*pauVar52) [16];
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  vint4 bi_1;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  vint4 ai_1;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  vint4 bi_2;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  vint4 bi;
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar92;
  float fVar93;
  float fVar105;
  float fVar106;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar111;
  float fVar116;
  float fVar117;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar115 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  vint4 ai;
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  float fVar143;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar144 [64];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_150c;
  ulong local_1508;
  ulong local_1500;
  RayHit *local_14f8;
  RayQueryContext *local_14f0;
  ulong local_14e8;
  undefined8 local_14e0;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  long local_14c0;
  long local_14b8;
  RTCFilterFunctionNArguments local_14b0;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  float local_1430;
  float local_142c;
  float local_1428;
  undefined4 local_1424;
  undefined4 local_1420;
  undefined4 local_141c;
  uint local_1418;
  uint local_1414;
  uint local_1410;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [16];
  undefined4 uStack_1310;
  undefined4 uStack_130c;
  undefined4 uStack_1308;
  undefined4 uStack_1304;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  float local_11e0 [4];
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  undefined4 uStack_11c4;
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  undefined1 local_1180 [32];
  undefined1 local_1160 [8];
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined4 local_1120;
  undefined4 uStack_111c;
  undefined4 uStack_1118;
  undefined4 uStack_1114;
  undefined4 uStack_1110;
  undefined4 uStack_110c;
  undefined4 uStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  ulong uVar48;
  float fVar74;
  float fVar83;
  float fVar84;
  float fVar85;
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    pauVar52 = (undefined1 (*) [16])local_f90;
    uStack_f98 = 0;
    auVar63 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar65 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar100._8_4_ = 0x7fffffff;
    auVar100._0_8_ = 0x7fffffff7fffffff;
    auVar100._12_4_ = 0x7fffffff;
    auVar100 = vandps_avx((undefined1  [16])aVar2,auVar100);
    auVar94._8_4_ = 0x219392ef;
    auVar94._0_8_ = 0x219392ef219392ef;
    auVar94._12_4_ = 0x219392ef;
    auVar100 = vcmpps_avx(auVar100,auVar94,1);
    auVar100 = vblendvps_avx((undefined1  [16])aVar2,auVar94,auVar100);
    auVar94 = vrcpps_avx(auVar100);
    auVar95._8_4_ = 0x3f800000;
    auVar95._0_8_ = 0x3f8000003f800000;
    auVar95._12_4_ = 0x3f800000;
    auVar100 = vfnmadd231ps_fma(auVar95,auVar94,auVar100);
    auVar95 = vfmadd132ps_fma(auVar100,auVar94,auVar94);
    fVar92 = auVar95._0_4_;
    local_1350._4_4_ = fVar92;
    local_1350._0_4_ = fVar92;
    local_1350._8_4_ = fVar92;
    local_1350._12_4_ = fVar92;
    auVar135 = ZEXT1664(local_1350);
    auVar100 = vmovshdup_avx(auVar95);
    local_1360 = vshufps_avx(auVar95,auVar95,0x55);
    auVar138 = ZEXT1664(local_1360);
    auVar94 = vshufpd_avx(auVar95,auVar95,1);
    local_1370 = vshufps_avx(auVar95,auVar95,0xaa);
    auVar139 = ZEXT1664(local_1370);
    auVar96._0_4_ = fVar92 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar96._4_4_ = auVar95._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar96._8_4_ = auVar95._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar96._12_4_ = auVar95._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    auVar95 = vshufps_avx(auVar96,auVar96,0x55);
    auVar64 = vshufps_avx(auVar96,auVar96,0xaa);
    uVar50 = (ulong)(fVar92 < 0.0) << 2;
    uVar51 = (ulong)(auVar100._0_4_ < 0.0) * 4 + 8;
    uVar1 = (ulong)(auVar94._0_4_ < 0.0) * 4 + 0x10;
    uVar41 = auVar65._0_4_;
    auVar62 = ZEXT1664(CONCAT412(uVar41,CONCAT48(uVar41,CONCAT44(uVar41,uVar41))));
    uVar53 = uVar50 ^ 4;
    uVar56 = uVar51 ^ 4;
    uVar55 = CONCAT44(auVar96._0_4_,auVar96._0_4_);
    local_1380._0_8_ = uVar55 ^ 0x8000000080000000;
    local_1380._8_4_ = -auVar96._0_4_;
    local_1380._12_4_ = -auVar96._0_4_;
    auVar140 = ZEXT1664(local_1380);
    local_1390._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
    local_1390._8_4_ = auVar95._8_4_ ^ 0x80000000;
    local_1390._12_4_ = auVar95._12_4_ ^ 0x80000000;
    auVar142 = ZEXT1664(local_1390);
    local_13a0._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
    local_13a0._8_4_ = auVar64._8_4_ ^ 0x80000000;
    local_13a0._12_4_ = auVar64._12_4_ ^ 0x80000000;
    auVar144 = ZEXT1664(local_13a0);
    uVar41 = auVar63._0_4_;
    local_13b0._4_4_ = uVar41;
    local_13b0._0_4_ = uVar41;
    local_13b0._8_4_ = uVar41;
    local_13b0._12_4_ = uVar41;
    auVar152 = ZEXT1664(local_13b0);
    local_1140._16_16_ = mm_lookupmask_ps._240_16_;
    local_1140._0_16_ = mm_lookupmask_ps._0_16_;
    auVar60._8_4_ = 0x3f800000;
    auVar60._0_8_ = 0x3f8000003f800000;
    auVar60._12_4_ = 0x3f800000;
    auVar60._16_4_ = 0x3f800000;
    auVar60._20_4_ = 0x3f800000;
    auVar60._24_4_ = 0x3f800000;
    auVar60._28_4_ = 0x3f800000;
    auVar59._8_4_ = 0xbf800000;
    auVar59._0_8_ = 0xbf800000bf800000;
    auVar59._12_4_ = 0xbf800000;
    auVar59._16_4_ = 0xbf800000;
    auVar59._20_4_ = 0xbf800000;
    auVar59._24_4_ = 0xbf800000;
    auVar59._28_4_ = 0xbf800000;
    _local_1160 = vblendvps_avx(auVar60,auVar59,local_1140);
    local_14f0 = context;
    local_14f8 = ray;
    local_1500 = uVar50;
    local_1508 = uVar51;
    local_14e8 = uVar53;
LAB_014a2bc2:
    if (pauVar52 != (undefined1 (*) [16])&local_fa0) {
      pauVar39 = pauVar52 + -1;
      pauVar52 = pauVar52 + -1;
      if (*(float *)(*pauVar39 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar55 = *(ulong *)*pauVar52;
        while ((uVar55 & 8) == 0) {
          uVar54 = uVar55 & 0xfffffffffffffff0;
          puVar42 = (ulong *)(uVar54 + 0x20);
          if (uVar54 == 0) {
            puVar42 = (ulong *)0x0;
          }
          uVar41 = (undefined4)puVar42[3];
          auVar75._4_4_ = uVar41;
          auVar75._0_4_ = uVar41;
          auVar75._8_4_ = uVar41;
          auVar75._12_4_ = uVar41;
          uVar41 = *(undefined4 *)((long)puVar42 + 0x24);
          auVar86._4_4_ = uVar41;
          auVar86._0_4_ = uVar41;
          auVar86._8_4_ = uVar41;
          auVar86._12_4_ = uVar41;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = *(ulong *)((long)puVar42 + uVar50);
          auVar100 = vpmovzxbd_avx(auVar63);
          auVar100 = vcvtdq2ps_avx(auVar100);
          auVar65 = vfmadd213ps_fma(auVar100,auVar86,auVar75);
          auVar64._8_8_ = 0;
          auVar64._0_8_ = *(ulong *)((long)puVar42 + uVar53);
          auVar100 = vpmovzxbd_avx(auVar64);
          auVar100 = vcvtdq2ps_avx(auVar100);
          auVar94 = vfmadd213ps_fma(auVar100,auVar86,auVar75);
          uVar41 = *(undefined4 *)((long)puVar42 + 0x1c);
          auVar97._4_4_ = uVar41;
          auVar97._0_4_ = uVar41;
          auVar97._8_4_ = uVar41;
          auVar97._12_4_ = uVar41;
          uVar41 = (undefined4)puVar42[5];
          auVar112._4_4_ = uVar41;
          auVar112._0_4_ = uVar41;
          auVar112._8_4_ = uVar41;
          auVar112._12_4_ = uVar41;
          auVar76._8_8_ = 0;
          auVar76._0_8_ = *(ulong *)((long)puVar42 + uVar51);
          auVar100 = vpmovzxbd_avx(auVar76);
          auVar100 = vcvtdq2ps_avx(auVar100);
          auVar95 = vfmadd213ps_fma(auVar100,auVar112,auVar97);
          auVar77._8_8_ = 0;
          auVar77._0_8_ = *(ulong *)((long)puVar42 + uVar56);
          auVar100 = vpmovzxbd_avx(auVar77);
          auVar100 = vcvtdq2ps_avx(auVar100);
          auVar64 = vfmadd213ps_fma(auVar100,auVar112,auVar97);
          uVar41 = (undefined4)puVar42[4];
          auVar98._4_4_ = uVar41;
          auVar98._0_4_ = uVar41;
          auVar98._8_4_ = uVar41;
          auVar98._12_4_ = uVar41;
          uVar41 = *(undefined4 *)((long)puVar42 + 0x2c);
          auVar113._4_4_ = uVar41;
          auVar113._0_4_ = uVar41;
          auVar113._8_4_ = uVar41;
          auVar113._12_4_ = uVar41;
          auVar122._8_8_ = 0;
          auVar122._0_8_ = *(ulong *)((long)puVar42 + uVar1);
          auVar100 = vpmovzxbd_avx(auVar122);
          auVar100 = vcvtdq2ps_avx(auVar100);
          auVar96 = vfmadd213ps_fma(auVar100,auVar113,auVar98);
          auVar125._8_8_ = 0;
          auVar125._0_8_ = *(ulong *)((long)puVar42 + (uVar1 ^ 4));
          auVar100 = vpmovzxbd_avx(auVar125);
          auVar100 = vcvtdq2ps_avx(auVar100);
          auVar75 = vfmadd213ps_fma(auVar100,auVar113,auVar98);
          auVar99._8_8_ = 0;
          auVar99._0_8_ = *puVar42;
          auVar114._8_8_ = 0;
          auVar114._0_8_ = *(ulong *)((long)puVar42 + 4);
          auVar63 = vpminub_avx(auVar99,auVar114);
          auVar100 = vpcmpeqb_avx(auVar99,auVar63);
          auVar63 = vpcmpeqd_avx(auVar63,auVar63);
          auVar100 = vpmovzxbd_avx(auVar100 ^ auVar63);
          auVar100 = vpslld_avx(auVar100 ^ auVar63,0x1f);
          uVar44 = vmovmskps_avx(auVar100);
          auVar100 = vfmadd213ps_fma(auVar65,auVar135._0_16_,auVar140._0_16_);
          auVar63 = vfmadd213ps_fma(auVar95,auVar138._0_16_,auVar142._0_16_);
          auVar100 = vpmaxsd_avx(auVar100,auVar63);
          auVar63 = vfmadd213ps_fma(auVar96,auVar139._0_16_,auVar144._0_16_);
          auVar63 = vpmaxsd_avx(auVar63,auVar152._0_16_);
          local_1320 = vpmaxsd_avx(auVar100,auVar63);
          auVar100 = vfmadd213ps_fma(auVar94,auVar135._0_16_,auVar140._0_16_);
          auVar63 = vfmadd213ps_fma(auVar64,auVar138._0_16_,auVar142._0_16_);
          auVar100 = vpminsd_avx(auVar100,auVar63);
          auVar63 = vfmadd213ps_fma(auVar75,auVar139._0_16_,auVar144._0_16_);
          auVar63 = vpminsd_avx(auVar63,auVar62._0_16_);
          auVar100 = vpminsd_avx(auVar100,auVar63);
          auVar100 = vpcmpgtd_avx(local_1320,auVar100);
          uVar41 = vmovmskps_avx(auVar100);
          bVar40 = ~(byte)uVar41 & (byte)uVar44;
          if (bVar40 == 0) goto LAB_014a2bc2;
          lVar22 = 0;
          for (uVar55 = (ulong)bVar40; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000)
          {
            lVar22 = lVar22 + 1;
          }
          uVar55 = *(ulong *)(uVar54 + lVar22 * 8);
          uVar45 = bVar40 - 1 & (uint)bVar40;
          uVar48 = (ulong)uVar45;
          if (uVar45 != 0) {
            uVar47 = *(uint *)(local_1320 + lVar22 * 4);
            lVar22 = 0;
            for (; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
              lVar22 = lVar22 + 1;
            }
            uVar45 = uVar45 - 1 & uVar45;
            uVar49 = (ulong)uVar45;
            uVar48 = *(ulong *)(uVar54 + lVar22 * 8);
            uVar46 = *(uint *)(local_1320 + lVar22 * 4);
            if (uVar45 == 0) {
              if (uVar47 < uVar46) {
                *(ulong *)*pauVar52 = uVar48;
                *(uint *)(*pauVar52 + 8) = uVar46;
                pauVar52 = pauVar52 + 1;
              }
              else {
                *(ulong *)*pauVar52 = uVar55;
                *(uint *)(*pauVar52 + 8) = uVar47;
                pauVar52 = pauVar52 + 1;
                uVar55 = uVar48;
              }
            }
            else {
              auVar65._8_8_ = 0;
              auVar65._0_8_ = uVar55;
              auVar100 = vpunpcklqdq_avx(auVar65,ZEXT416(uVar47));
              auVar69._8_8_ = 0;
              auVar69._0_8_ = uVar48;
              auVar63 = vpunpcklqdq_avx(auVar69,ZEXT416(uVar46));
              lVar22 = 0;
              for (; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
                lVar22 = lVar22 + 1;
              }
              uVar45 = uVar45 - 1 & uVar45;
              uVar55 = (ulong)uVar45;
              auVar78._8_8_ = 0;
              auVar78._0_8_ = *(ulong *)(uVar54 + lVar22 * 8);
              auVar94 = vpunpcklqdq_avx(auVar78,ZEXT416(*(uint *)(local_1320 + lVar22 * 4)));
              auVar65 = vpcmpgtd_avx(auVar63,auVar100);
              if (uVar45 == 0) {
                auVar95 = vpshufd_avx(auVar65,0xaa);
                auVar65 = vblendvps_avx(auVar63,auVar100,auVar95);
                auVar100 = vblendvps_avx(auVar100,auVar63,auVar95);
                auVar63 = vpcmpgtd_avx(auVar94,auVar65);
                auVar95 = vpshufd_avx(auVar63,0xaa);
                auVar63 = vblendvps_avx(auVar94,auVar65,auVar95);
                auVar65 = vblendvps_avx(auVar65,auVar94,auVar95);
                auVar94 = vpcmpgtd_avx(auVar65,auVar100);
                auVar95 = vpshufd_avx(auVar94,0xaa);
                auVar94 = vblendvps_avx(auVar65,auVar100,auVar95);
                auVar100 = vblendvps_avx(auVar100,auVar65,auVar95);
                *pauVar52 = auVar100;
                pauVar52[1] = auVar94;
                uVar55 = auVar63._0_8_;
                pauVar52 = pauVar52 + 2;
              }
              else {
                lVar22 = 0;
                for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
                  lVar22 = lVar22 + 1;
                }
                auVar101._8_8_ = 0;
                auVar101._0_8_ = *(ulong *)(uVar54 + lVar22 * 8);
                auVar64 = vpunpcklqdq_avx(auVar101,ZEXT416(*(uint *)(local_1320 + lVar22 * 4)));
                auVar95 = vpshufd_avx(auVar65,0xaa);
                auVar65 = vblendvps_avx(auVar63,auVar100,auVar95);
                auVar100 = vblendvps_avx(auVar100,auVar63,auVar95);
                auVar63 = vpcmpgtd_avx(auVar64,auVar94);
                auVar95 = vpshufd_avx(auVar63,0xaa);
                auVar63 = vblendvps_avx(auVar64,auVar94,auVar95);
                auVar94 = vblendvps_avx(auVar94,auVar64,auVar95);
                auVar95 = vpcmpgtd_avx(auVar94,auVar100);
                auVar64 = vpshufd_avx(auVar95,0xaa);
                auVar95 = vblendvps_avx(auVar94,auVar100,auVar64);
                auVar100 = vblendvps_avx(auVar100,auVar94,auVar64);
                auVar94 = vpcmpgtd_avx(auVar63,auVar65);
                auVar64 = vpshufd_avx(auVar94,0xaa);
                auVar94 = vblendvps_avx(auVar63,auVar65,auVar64);
                auVar63 = vblendvps_avx(auVar65,auVar63,auVar64);
                auVar65 = vpcmpgtd_avx(auVar95,auVar63);
                auVar64 = vpshufd_avx(auVar65,0xaa);
                auVar65 = vblendvps_avx(auVar95,auVar63,auVar64);
                auVar63 = vblendvps_avx(auVar63,auVar95,auVar64);
                *pauVar52 = auVar100;
                pauVar52[1] = auVar63;
                pauVar52[2] = auVar65;
                uVar55 = auVar94._0_8_;
                pauVar52 = pauVar52 + 3;
              }
            }
          }
        }
        local_14c0 = (ulong)((uint)uVar55 & 0xf) - 8;
        uVar55 = uVar55 & 0xfffffffffffffff0;
        for (local_14b8 = 0; local_14b8 != local_14c0; local_14b8 = local_14b8 + 1) {
          lVar43 = local_14b8 * 0x60;
          pSVar3 = context->scene;
          ppfVar4 = (pSVar3->vertices).items;
          pfVar5 = ppfVar4[*(uint *)(uVar55 + 0x40 + lVar43)];
          auVar70._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar55 + 0x20 + lVar43));
          auVar70._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar55 + lVar43));
          pfVar6 = ppfVar4[*(uint *)(uVar55 + 0x48 + lVar43)];
          auVar79._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar55 + 0x28 + lVar43));
          auVar79._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar55 + 8 + lVar43));
          pfVar7 = ppfVar4[*(uint *)(uVar55 + 0x44 + lVar43)];
          auVar102._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar55 + 0x24 + lVar43));
          auVar102._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar55 + 4 + lVar43));
          pfVar8 = ppfVar4[*(uint *)(uVar55 + 0x4c + lVar43)];
          auVar132._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar55 + 0x2c + lVar43));
          auVar132._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar55 + 0xc + lVar43));
          lVar22 = uVar55 + 0x40 + lVar43;
          local_fc0 = *(undefined8 *)(lVar22 + 0x10);
          uStack_fb8 = *(undefined8 *)(lVar22 + 0x18);
          uStack_fb0 = local_fc0;
          uStack_fa8 = uStack_fb8;
          lVar22 = uVar55 + 0x50 + lVar43;
          local_1340 = *(undefined8 *)(lVar22 + 0x10);
          uStack_1338 = *(undefined8 *)(lVar22 + 0x18);
          auVar65 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar55 + 0x10 + lVar43))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar55 + 0x18 + lVar43)));
          auVar100 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar55 + 0x10 + lVar43)),
                                   *(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar55 + 0x18 + lVar43)));
          auVar94 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar55 + 0x14 + lVar43))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar55 + 0x1c + lVar43)));
          auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar55 + 0x14 + lVar43))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar55 + 0x1c + lVar43)));
          auVar95 = vunpcklps_avx(auVar100,auVar63);
          auVar64 = vunpcklps_avx(auVar65,auVar94);
          auVar100 = vunpckhps_avx(auVar65,auVar94);
          auVar94 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar55 + 0x30 + lVar43))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar55 + 0x38 + lVar43)));
          auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar55 + 0x30 + lVar43))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar55 + 0x38 + lVar43)));
          auVar96 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar55 + 0x34 + lVar43))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar55 + 0x3c + lVar43)));
          auVar65 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar55 + 0x34 + lVar43))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar55 + 0x3c + lVar43)));
          auVar65 = vunpcklps_avx(auVar63,auVar65);
          auVar75 = vunpcklps_avx(auVar94,auVar96);
          auVar63 = vunpckhps_avx(auVar94,auVar96);
          uStack_1330 = local_1340;
          uStack_1328 = uStack_1338;
          auVar59 = vunpcklps_avx(auVar102,auVar132);
          auVar60 = vunpcklps_avx(auVar70,auVar79);
          auVar21 = vunpcklps_avx(auVar60,auVar59);
          auVar59 = vunpckhps_avx(auVar60,auVar59);
          auVar60 = vunpckhps_avx(auVar102,auVar132);
          auVar82 = vunpckhps_avx(auVar70,auVar79);
          auVar60 = vunpcklps_avx(auVar82,auVar60);
          auVar136._16_16_ = auVar64;
          auVar136._0_16_ = auVar64;
          auVar103._16_16_ = auVar100;
          auVar103._0_16_ = auVar100;
          auVar123._16_16_ = auVar95;
          auVar123._0_16_ = auVar95;
          auVar151._16_16_ = auVar75;
          auVar151._0_16_ = auVar75;
          auVar87._16_16_ = auVar63;
          auVar87._0_16_ = auVar63;
          uVar41 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar126._4_4_ = uVar41;
          auVar126._0_4_ = uVar41;
          auVar126._8_4_ = uVar41;
          auVar126._12_4_ = uVar41;
          auVar126._16_4_ = uVar41;
          auVar126._20_4_ = uVar41;
          auVar126._24_4_ = uVar41;
          auVar126._28_4_ = uVar41;
          uVar41 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar133._4_4_ = uVar41;
          auVar133._0_4_ = uVar41;
          auVar133._8_4_ = uVar41;
          auVar133._12_4_ = uVar41;
          auVar133._16_4_ = uVar41;
          auVar133._20_4_ = uVar41;
          auVar133._24_4_ = uVar41;
          auVar133._28_4_ = uVar41;
          auVar57._16_16_ = auVar65;
          auVar57._0_16_ = auVar65;
          uVar41 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar141._4_4_ = uVar41;
          auVar141._0_4_ = uVar41;
          auVar141._8_4_ = uVar41;
          auVar141._12_4_ = uVar41;
          auVar141._16_4_ = uVar41;
          auVar141._20_4_ = uVar41;
          auVar141._24_4_ = uVar41;
          auVar141._28_4_ = uVar41;
          local_13e0 = vsubps_avx(auVar21,auVar126);
          local_fe0 = vsubps_avx(auVar59,auVar133);
          local_1000 = vsubps_avx(auVar60,auVar141);
          auVar59 = vsubps_avx(auVar136,auVar126);
          auVar60 = vsubps_avx(auVar103,auVar133);
          auVar82 = vsubps_avx(auVar123,auVar141);
          auVar21 = vsubps_avx(auVar151,auVar126);
          auVar70 = vsubps_avx(auVar87,auVar133);
          auVar19 = vsubps_avx(auVar57,auVar141);
          local_1020 = vsubps_avx(auVar21,local_13e0);
          local_1060 = vsubps_avx(auVar70,local_fe0);
          local_1040 = vsubps_avx(auVar19,local_1000);
          auVar58._0_4_ = auVar21._0_4_ + local_13e0._0_4_;
          auVar58._4_4_ = auVar21._4_4_ + local_13e0._4_4_;
          auVar58._8_4_ = auVar21._8_4_ + local_13e0._8_4_;
          auVar58._12_4_ = auVar21._12_4_ + local_13e0._12_4_;
          auVar58._16_4_ = auVar21._16_4_ + local_13e0._16_4_;
          auVar58._20_4_ = auVar21._20_4_ + local_13e0._20_4_;
          auVar58._24_4_ = auVar21._24_4_ + local_13e0._24_4_;
          auVar58._28_4_ = auVar21._28_4_ + local_13e0._28_4_;
          auVar71._0_4_ = local_fe0._0_4_ + auVar70._0_4_;
          auVar71._4_4_ = local_fe0._4_4_ + auVar70._4_4_;
          auVar71._8_4_ = local_fe0._8_4_ + auVar70._8_4_;
          auVar71._12_4_ = local_fe0._12_4_ + auVar70._12_4_;
          auVar71._16_4_ = local_fe0._16_4_ + auVar70._16_4_;
          auVar71._20_4_ = local_fe0._20_4_ + auVar70._20_4_;
          auVar71._24_4_ = local_fe0._24_4_ + auVar70._24_4_;
          auVar71._28_4_ = local_fe0._28_4_ + auVar70._28_4_;
          fVar92 = local_1000._0_4_;
          auVar88._0_4_ = auVar19._0_4_ + fVar92;
          fVar10 = local_1000._4_4_;
          auVar88._4_4_ = auVar19._4_4_ + fVar10;
          fVar11 = local_1000._8_4_;
          auVar88._8_4_ = auVar19._8_4_ + fVar11;
          fVar12 = local_1000._12_4_;
          auVar88._12_4_ = auVar19._12_4_ + fVar12;
          fVar13 = local_1000._16_4_;
          auVar88._16_4_ = auVar19._16_4_ + fVar13;
          fVar14 = local_1000._20_4_;
          auVar88._20_4_ = auVar19._20_4_ + fVar14;
          fVar15 = local_1000._24_4_;
          auVar88._24_4_ = auVar19._24_4_ + fVar15;
          fVar74 = local_1000._28_4_;
          auVar88._28_4_ = auVar19._28_4_ + fVar74;
          auVar20._4_4_ = local_1040._4_4_ * auVar71._4_4_;
          auVar20._0_4_ = local_1040._0_4_ * auVar71._0_4_;
          auVar20._8_4_ = local_1040._8_4_ * auVar71._8_4_;
          auVar20._12_4_ = local_1040._12_4_ * auVar71._12_4_;
          auVar20._16_4_ = local_1040._16_4_ * auVar71._16_4_;
          auVar20._20_4_ = local_1040._20_4_ * auVar71._20_4_;
          auVar20._24_4_ = local_1040._24_4_ * auVar71._24_4_;
          auVar20._28_4_ = uVar41;
          auVar63 = vfmsub231ps_fma(auVar20,local_1060,auVar88);
          auVar23._4_4_ = local_1020._4_4_ * auVar88._4_4_;
          auVar23._0_4_ = local_1020._0_4_ * auVar88._0_4_;
          auVar23._8_4_ = local_1020._8_4_ * auVar88._8_4_;
          auVar23._12_4_ = local_1020._12_4_ * auVar88._12_4_;
          auVar23._16_4_ = local_1020._16_4_ * auVar88._16_4_;
          auVar23._20_4_ = local_1020._20_4_ * auVar88._20_4_;
          auVar23._24_4_ = local_1020._24_4_ * auVar88._24_4_;
          auVar23._28_4_ = auVar88._28_4_;
          auVar100 = vfmsub231ps_fma(auVar23,local_1040,auVar58);
          auVar24._4_4_ = auVar58._4_4_ * local_1060._4_4_;
          auVar24._0_4_ = auVar58._0_4_ * local_1060._0_4_;
          auVar24._8_4_ = auVar58._8_4_ * local_1060._8_4_;
          auVar24._12_4_ = auVar58._12_4_ * local_1060._12_4_;
          auVar24._16_4_ = auVar58._16_4_ * local_1060._16_4_;
          auVar24._20_4_ = auVar58._20_4_ * local_1060._20_4_;
          auVar24._24_4_ = auVar58._24_4_ * local_1060._24_4_;
          auVar24._28_4_ = auVar58._28_4_;
          auVar65 = vfmsub231ps_fma(auVar24,local_1020,auVar71);
          uVar41 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
          local_1460._4_4_ = uVar41;
          local_1460._0_4_ = uVar41;
          local_1460._8_4_ = uVar41;
          local_1460._12_4_ = uVar41;
          local_1460._16_4_ = uVar41;
          local_1460._20_4_ = uVar41;
          local_1460._24_4_ = uVar41;
          local_1460._28_4_ = uVar41;
          local_14e0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar25._4_4_ = local_14e0._4_4_ * auVar65._4_4_;
          auVar25._0_4_ = local_14e0._4_4_ * auVar65._0_4_;
          auVar25._8_4_ = local_14e0._4_4_ * auVar65._8_4_;
          auVar25._12_4_ = local_14e0._4_4_ * auVar65._12_4_;
          auVar25._16_4_ = local_14e0._4_4_ * 0.0;
          auVar25._20_4_ = local_14e0._4_4_ * 0.0;
          auVar25._24_4_ = local_14e0._4_4_ * 0.0;
          auVar25._28_4_ = local_1040._28_4_;
          auVar100 = vfmadd231ps_fma(auVar25,local_1460,ZEXT1632(auVar100));
          uVar41 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          auVar124._4_4_ = uVar41;
          auVar124._0_4_ = uVar41;
          auVar124._8_4_ = uVar41;
          auVar124._12_4_ = uVar41;
          auVar124._16_4_ = uVar41;
          auVar124._20_4_ = uVar41;
          auVar124._24_4_ = uVar41;
          auVar124._28_4_ = uVar41;
          local_1320 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar124,ZEXT1632(auVar63));
          local_1080 = vsubps_avx(local_fe0,auVar60);
          local_10a0 = vsubps_avx(local_1000,auVar82);
          auVar72._0_4_ = local_fe0._0_4_ + auVar60._0_4_;
          auVar72._4_4_ = local_fe0._4_4_ + auVar60._4_4_;
          auVar72._8_4_ = local_fe0._8_4_ + auVar60._8_4_;
          auVar72._12_4_ = local_fe0._12_4_ + auVar60._12_4_;
          auVar72._16_4_ = local_fe0._16_4_ + auVar60._16_4_;
          auVar72._20_4_ = local_fe0._20_4_ + auVar60._20_4_;
          auVar72._24_4_ = local_fe0._24_4_ + auVar60._24_4_;
          auVar72._28_4_ = local_fe0._28_4_ + auVar60._28_4_;
          auVar89._0_4_ = auVar82._0_4_ + fVar92;
          auVar89._4_4_ = auVar82._4_4_ + fVar10;
          auVar89._8_4_ = auVar82._8_4_ + fVar11;
          auVar89._12_4_ = auVar82._12_4_ + fVar12;
          auVar89._16_4_ = auVar82._16_4_ + fVar13;
          auVar89._20_4_ = auVar82._20_4_ + fVar14;
          auVar89._24_4_ = auVar82._24_4_ + fVar15;
          auVar89._28_4_ = auVar82._28_4_ + fVar74;
          fVar83 = local_10a0._0_4_;
          fVar84 = local_10a0._4_4_;
          auVar26._4_4_ = auVar72._4_4_ * fVar84;
          auVar26._0_4_ = auVar72._0_4_ * fVar83;
          fVar93 = local_10a0._8_4_;
          auVar26._8_4_ = auVar72._8_4_ * fVar93;
          fVar106 = local_10a0._12_4_;
          auVar26._12_4_ = auVar72._12_4_ * fVar106;
          fVar108 = local_10a0._16_4_;
          auVar26._16_4_ = auVar72._16_4_ * fVar108;
          fVar110 = local_10a0._20_4_;
          auVar26._20_4_ = auVar72._20_4_ * fVar110;
          fVar17 = local_10a0._24_4_;
          auVar26._24_4_ = auVar72._24_4_ * fVar17;
          auVar26._28_4_ = fVar74;
          auVar63 = vfmsub231ps_fma(auVar26,local_1080,auVar89);
          local_10c0 = vsubps_avx(local_13e0,auVar59);
          fVar143 = local_10c0._0_4_;
          fVar145 = local_10c0._4_4_;
          auVar27._4_4_ = fVar145 * auVar89._4_4_;
          auVar27._0_4_ = fVar143 * auVar89._0_4_;
          fVar146 = local_10c0._8_4_;
          auVar27._8_4_ = fVar146 * auVar89._8_4_;
          fVar147 = local_10c0._12_4_;
          auVar27._12_4_ = fVar147 * auVar89._12_4_;
          fVar148 = local_10c0._16_4_;
          auVar27._16_4_ = fVar148 * auVar89._16_4_;
          fVar149 = local_10c0._20_4_;
          auVar27._20_4_ = fVar149 * auVar89._20_4_;
          fVar150 = local_10c0._24_4_;
          auVar27._24_4_ = fVar150 * auVar89._24_4_;
          auVar27._28_4_ = auVar89._28_4_;
          auVar127._0_4_ = local_13e0._0_4_ + auVar59._0_4_;
          auVar127._4_4_ = local_13e0._4_4_ + auVar59._4_4_;
          auVar127._8_4_ = local_13e0._8_4_ + auVar59._8_4_;
          auVar127._12_4_ = local_13e0._12_4_ + auVar59._12_4_;
          auVar127._16_4_ = local_13e0._16_4_ + auVar59._16_4_;
          auVar127._20_4_ = local_13e0._20_4_ + auVar59._20_4_;
          auVar127._24_4_ = local_13e0._24_4_ + auVar59._24_4_;
          auVar127._28_4_ = local_13e0._28_4_ + auVar59._28_4_;
          auVar100 = vfmsub231ps_fma(auVar27,local_10a0,auVar127);
          fVar74 = local_1080._0_4_;
          fVar85 = local_1080._4_4_;
          auVar28._4_4_ = auVar127._4_4_ * fVar85;
          auVar28._0_4_ = auVar127._0_4_ * fVar74;
          fVar105 = local_1080._8_4_;
          auVar28._8_4_ = auVar127._8_4_ * fVar105;
          fVar107 = local_1080._12_4_;
          auVar28._12_4_ = auVar127._12_4_ * fVar107;
          fVar109 = local_1080._16_4_;
          auVar28._16_4_ = auVar127._16_4_ * fVar109;
          fVar16 = local_1080._20_4_;
          auVar28._20_4_ = auVar127._20_4_ * fVar16;
          fVar18 = local_1080._24_4_;
          auVar28._24_4_ = auVar127._24_4_ * fVar18;
          auVar28._28_4_ = auVar127._28_4_;
          auVar65 = vfmsub231ps_fma(auVar28,local_10c0,auVar72);
          auVar29._4_4_ = local_14e0._4_4_ * auVar65._4_4_;
          auVar29._0_4_ = local_14e0._4_4_ * auVar65._0_4_;
          auVar29._8_4_ = local_14e0._4_4_ * auVar65._8_4_;
          auVar29._12_4_ = local_14e0._4_4_ * auVar65._12_4_;
          auVar29._16_4_ = local_14e0._4_4_ * 0.0;
          auVar29._20_4_ = local_14e0._4_4_ * 0.0;
          auVar29._24_4_ = local_14e0._4_4_ * 0.0;
          auVar29._28_4_ = auVar72._28_4_;
          auVar100 = vfmadd231ps_fma(auVar29,local_1460,ZEXT1632(auVar100));
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar124,ZEXT1632(auVar63));
          auVar20 = vsubps_avx(auVar59,auVar21);
          auVar80._0_4_ = auVar21._0_4_ + auVar59._0_4_;
          auVar80._4_4_ = auVar21._4_4_ + auVar59._4_4_;
          auVar80._8_4_ = auVar21._8_4_ + auVar59._8_4_;
          auVar80._12_4_ = auVar21._12_4_ + auVar59._12_4_;
          auVar80._16_4_ = auVar21._16_4_ + auVar59._16_4_;
          auVar80._20_4_ = auVar21._20_4_ + auVar59._20_4_;
          auVar80._24_4_ = auVar21._24_4_ + auVar59._24_4_;
          auVar80._28_4_ = auVar21._28_4_ + auVar59._28_4_;
          auVar21 = vsubps_avx(auVar60,auVar70);
          auVar104._0_4_ = auVar60._0_4_ + auVar70._0_4_;
          auVar104._4_4_ = auVar60._4_4_ + auVar70._4_4_;
          auVar104._8_4_ = auVar60._8_4_ + auVar70._8_4_;
          auVar104._12_4_ = auVar60._12_4_ + auVar70._12_4_;
          auVar104._16_4_ = auVar60._16_4_ + auVar70._16_4_;
          auVar104._20_4_ = auVar60._20_4_ + auVar70._20_4_;
          auVar104._24_4_ = auVar60._24_4_ + auVar70._24_4_;
          auVar104._28_4_ = auVar60._28_4_ + auVar70._28_4_;
          auVar70 = vsubps_avx(auVar82,auVar19);
          auVar66._0_4_ = auVar82._0_4_ + auVar19._0_4_;
          auVar66._4_4_ = auVar82._4_4_ + auVar19._4_4_;
          auVar66._8_4_ = auVar82._8_4_ + auVar19._8_4_;
          auVar66._12_4_ = auVar82._12_4_ + auVar19._12_4_;
          auVar66._16_4_ = auVar82._16_4_ + auVar19._16_4_;
          auVar66._20_4_ = auVar82._20_4_ + auVar19._20_4_;
          auVar66._24_4_ = auVar82._24_4_ + auVar19._24_4_;
          auVar66._28_4_ = auVar82._28_4_ + auVar19._28_4_;
          auVar115._0_4_ = auVar70._0_4_ * auVar104._0_4_;
          auVar115._4_4_ = auVar70._4_4_ * auVar104._4_4_;
          auVar115._8_4_ = auVar70._8_4_ * auVar104._8_4_;
          auVar115._12_4_ = auVar70._12_4_ * auVar104._12_4_;
          auVar115._16_4_ = auVar70._16_4_ * auVar104._16_4_;
          auVar115._20_4_ = auVar70._20_4_ * auVar104._20_4_;
          auVar115._24_4_ = auVar70._24_4_ * auVar104._24_4_;
          auVar115._28_4_ = 0;
          auVar65 = vfmsub231ps_fma(auVar115,auVar21,auVar66);
          auVar82._4_4_ = auVar66._4_4_ * auVar20._4_4_;
          auVar82._0_4_ = auVar66._0_4_ * auVar20._0_4_;
          auVar82._8_4_ = auVar66._8_4_ * auVar20._8_4_;
          auVar82._12_4_ = auVar66._12_4_ * auVar20._12_4_;
          auVar82._16_4_ = auVar66._16_4_ * auVar20._16_4_;
          auVar82._20_4_ = auVar66._20_4_ * auVar20._20_4_;
          auVar82._24_4_ = auVar66._24_4_ * auVar20._24_4_;
          auVar82._28_4_ = auVar66._28_4_;
          auVar63 = vfmsub231ps_fma(auVar82,auVar70,auVar80);
          auVar19._4_4_ = auVar21._4_4_ * auVar80._4_4_;
          auVar19._0_4_ = auVar21._0_4_ * auVar80._0_4_;
          auVar19._8_4_ = auVar21._8_4_ * auVar80._8_4_;
          auVar19._12_4_ = auVar21._12_4_ * auVar80._12_4_;
          auVar19._16_4_ = auVar21._16_4_ * auVar80._16_4_;
          auVar19._20_4_ = auVar21._20_4_ * auVar80._20_4_;
          auVar19._24_4_ = auVar21._24_4_ * auVar80._24_4_;
          auVar19._28_4_ = auVar80._28_4_;
          auVar94 = vfmsub231ps_fma(auVar19,auVar20,auVar104);
          local_14e0._0_4_ = local_14e0._4_4_;
          fStack_14d8 = local_14e0._4_4_;
          fStack_14d4 = local_14e0._4_4_;
          fStack_14d0 = local_14e0._4_4_;
          fStack_14cc = local_14e0._4_4_;
          fStack_14c8 = local_14e0._4_4_;
          fStack_14c4 = local_14e0._4_4_;
          auVar81._0_4_ = local_14e0._4_4_ * auVar94._0_4_;
          auVar81._4_4_ = local_14e0._4_4_ * auVar94._4_4_;
          auVar81._8_4_ = local_14e0._4_4_ * auVar94._8_4_;
          auVar81._12_4_ = local_14e0._4_4_ * auVar94._12_4_;
          auVar81._16_4_ = local_14e0._4_4_ * 0.0;
          auVar81._20_4_ = local_14e0._4_4_ * 0.0;
          auVar81._24_4_ = local_14e0._4_4_ * 0.0;
          auVar81._28_4_ = 0;
          auVar63 = vfmadd231ps_fma(auVar81,local_1460,ZEXT1632(auVar63));
          auVar63 = vfmadd231ps_fma(ZEXT1632(auVar63),auVar124,ZEXT1632(auVar65));
          local_12e0 = ZEXT1632(CONCAT412(auVar63._12_4_ + local_1320._12_4_ + auVar100._12_4_,
                                          CONCAT48(auVar63._8_4_ + local_1320._8_4_ + auVar100._8_4_
                                                   ,CONCAT44(auVar63._4_4_ +
                                                             local_1320._4_4_ + auVar100._4_4_,
                                                             auVar63._0_4_ +
                                                             local_1320._0_4_ + auVar100._0_4_))));
          auVar67._8_4_ = 0x7fffffff;
          auVar67._0_8_ = 0x7fffffff7fffffff;
          auVar67._12_4_ = 0x7fffffff;
          auVar67._16_4_ = 0x7fffffff;
          auVar67._20_4_ = 0x7fffffff;
          auVar67._24_4_ = 0x7fffffff;
          auVar67._28_4_ = 0x7fffffff;
          local_1480 = ZEXT1632(local_1320);
          auVar59 = vminps_avx(local_1480,ZEXT1632(auVar100));
          auVar59 = vminps_avx(auVar59,ZEXT1632(auVar63));
          local_1100 = vandps_avx(local_12e0,auVar67);
          fVar111 = local_1100._0_4_ * 1.1920929e-07;
          fVar116 = local_1100._4_4_ * 1.1920929e-07;
          auVar30._4_4_ = fVar116;
          auVar30._0_4_ = fVar111;
          fVar117 = local_1100._8_4_ * 1.1920929e-07;
          auVar30._8_4_ = fVar117;
          fVar118 = local_1100._12_4_ * 1.1920929e-07;
          auVar30._12_4_ = fVar118;
          fVar119 = local_1100._16_4_ * 1.1920929e-07;
          auVar30._16_4_ = fVar119;
          fVar120 = local_1100._20_4_ * 1.1920929e-07;
          auVar30._20_4_ = fVar120;
          fVar121 = local_1100._24_4_ * 1.1920929e-07;
          auVar30._24_4_ = fVar121;
          auVar30._28_4_ = 0x34000000;
          auVar128._0_8_ = CONCAT44(fVar116,fVar111) ^ 0x8000000080000000;
          auVar128._8_4_ = -fVar117;
          auVar128._12_4_ = -fVar118;
          auVar128._16_4_ = -fVar119;
          auVar128._20_4_ = -fVar120;
          auVar128._24_4_ = -fVar121;
          auVar128._28_4_ = 0xb4000000;
          auVar59 = vcmpps_avx(auVar59,auVar128,5);
          local_10e0 = ZEXT1632(auVar100);
          auVar82 = vmaxps_avx(local_1480,local_10e0);
          auVar60 = vmaxps_avx(auVar82,ZEXT1632(auVar63));
          auVar60 = vcmpps_avx(auVar60,auVar30,2);
          auVar60 = vorps_avx(auVar59,auVar60);
          if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar60 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar60 >> 0x7f,0) != '\0') ||
                (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar60 >> 0xbf,0) != '\0') ||
              (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar60[0x1f] < '\0') {
            local_1120 = 0x80000000;
            uStack_111c = 0x80000000;
            uStack_1118 = 0x80000000;
            uStack_1114 = 0x80000000;
            uStack_1110 = 0x80000000;
            uStack_110c = 0x80000000;
            uStack_1108 = 0x80000000;
            uStack_1104 = 0x80000000;
            auVar31._4_4_ = fVar85 * local_1040._4_4_;
            auVar31._0_4_ = fVar74 * local_1040._0_4_;
            auVar31._8_4_ = fVar105 * local_1040._8_4_;
            auVar31._12_4_ = fVar107 * local_1040._12_4_;
            auVar31._16_4_ = fVar109 * local_1040._16_4_;
            auVar31._20_4_ = fVar16 * local_1040._20_4_;
            auVar31._24_4_ = fVar18 * local_1040._24_4_;
            auVar31._28_4_ = auVar59._28_4_;
            auVar32._4_4_ = local_1060._4_4_ * fVar145;
            auVar32._0_4_ = local_1060._0_4_ * fVar143;
            auVar32._8_4_ = local_1060._8_4_ * fVar146;
            auVar32._12_4_ = local_1060._12_4_ * fVar147;
            auVar32._16_4_ = local_1060._16_4_ * fVar148;
            auVar32._20_4_ = local_1060._20_4_ * fVar149;
            auVar32._24_4_ = local_1060._24_4_ * fVar150;
            auVar32._28_4_ = auVar82._28_4_;
            auVar63 = vfmsub213ps_fma(local_1060,local_10a0,auVar31);
            auVar33._4_4_ = fVar84 * auVar21._4_4_;
            auVar33._0_4_ = fVar83 * auVar21._0_4_;
            auVar33._8_4_ = fVar93 * auVar21._8_4_;
            auVar33._12_4_ = fVar106 * auVar21._12_4_;
            auVar33._16_4_ = fVar108 * auVar21._16_4_;
            auVar33._20_4_ = fVar110 * auVar21._20_4_;
            auVar33._24_4_ = fVar17 * auVar21._24_4_;
            auVar33._28_4_ = 0x34000000;
            auVar134._0_4_ = fVar143 * auVar70._0_4_;
            auVar134._4_4_ = fVar145 * auVar70._4_4_;
            auVar134._8_4_ = fVar146 * auVar70._8_4_;
            auVar134._12_4_ = fVar147 * auVar70._12_4_;
            auVar134._16_4_ = fVar148 * auVar70._16_4_;
            auVar134._20_4_ = fVar149 * auVar70._20_4_;
            auVar134._24_4_ = fVar150 * auVar70._24_4_;
            auVar134._28_4_ = 0;
            auVar65 = vfmsub213ps_fma(auVar70,local_1080,auVar33);
            auVar59 = vandps_avx(auVar31,auVar67);
            auVar82 = vandps_avx(auVar33,auVar67);
            auVar59 = vcmpps_avx(auVar59,auVar82,1);
            local_12c0 = vblendvps_avx(ZEXT1632(auVar65),ZEXT1632(auVar63),auVar59);
            auVar34._4_4_ = fVar85 * auVar20._4_4_;
            auVar34._0_4_ = fVar74 * auVar20._0_4_;
            auVar34._8_4_ = fVar105 * auVar20._8_4_;
            auVar34._12_4_ = fVar107 * auVar20._12_4_;
            auVar34._16_4_ = fVar109 * auVar20._16_4_;
            auVar34._20_4_ = fVar16 * auVar20._20_4_;
            auVar34._24_4_ = fVar18 * auVar20._24_4_;
            auVar34._28_4_ = auVar59._28_4_;
            auVar63 = vfmsub213ps_fma(auVar20,local_10a0,auVar134);
            auVar35._4_4_ = local_1020._4_4_ * fVar84;
            auVar35._0_4_ = local_1020._0_4_ * fVar83;
            auVar35._8_4_ = local_1020._8_4_ * fVar93;
            auVar35._12_4_ = local_1020._12_4_ * fVar106;
            auVar35._16_4_ = local_1020._16_4_ * fVar108;
            auVar35._20_4_ = local_1020._20_4_ * fVar110;
            auVar35._24_4_ = local_1020._24_4_ * fVar17;
            auVar35._28_4_ = auVar82._28_4_;
            auVar65 = vfmsub213ps_fma(local_1040,local_10c0,auVar35);
            auVar59 = vandps_avx(auVar35,auVar67);
            auVar82 = vandps_avx(auVar134,auVar67);
            auVar59 = vcmpps_avx(auVar59,auVar82,1);
            local_12a0 = vblendvps_avx(ZEXT1632(auVar63),ZEXT1632(auVar65),auVar59);
            auVar63 = vfmsub213ps_fma(local_1020,local_1080,auVar32);
            auVar65 = vfmsub213ps_fma(auVar21,local_10c0,auVar34);
            auVar59 = vandps_avx(auVar32,auVar67);
            auVar82 = vandps_avx(auVar34,auVar67);
            auVar82 = vcmpps_avx(auVar59,auVar82,1);
            local_1280 = vblendvps_avx(ZEXT1632(auVar65),ZEXT1632(auVar63),auVar82);
            auVar63 = vpackssdw_avx(auVar60._0_16_,auVar60._16_16_);
            fVar93 = local_1280._0_4_;
            fVar105 = local_1280._4_4_;
            auVar21._4_4_ = fVar105 * local_14e0._4_4_;
            auVar21._0_4_ = fVar93 * local_14e0._4_4_;
            fVar106 = local_1280._8_4_;
            auVar21._8_4_ = fVar106 * local_14e0._4_4_;
            fVar107 = local_1280._12_4_;
            auVar21._12_4_ = fVar107 * local_14e0._4_4_;
            fVar108 = local_1280._16_4_;
            auVar21._16_4_ = fVar108 * local_14e0._4_4_;
            fVar109 = local_1280._20_4_;
            auVar21._20_4_ = fVar109 * local_14e0._4_4_;
            fVar110 = local_1280._24_4_;
            auVar21._24_4_ = fVar110 * local_14e0._4_4_;
            auVar21._28_4_ = auVar60._28_4_;
            auVar65 = vfmadd213ps_fma(local_1460,local_12a0,auVar21);
            auVar65 = vfmadd213ps_fma(auVar124,local_12c0,ZEXT1632(auVar65));
            fVar74 = auVar65._0_4_ + auVar65._0_4_;
            fVar83 = auVar65._4_4_ + auVar65._4_4_;
            fVar84 = auVar65._8_4_ + auVar65._8_4_;
            fVar85 = auVar65._12_4_ + auVar65._12_4_;
            auVar82 = ZEXT1632(CONCAT412(fVar85,CONCAT48(fVar84,CONCAT44(fVar83,fVar74))));
            auVar36._4_4_ = fVar105 * fVar10;
            auVar36._0_4_ = fVar93 * fVar92;
            auVar36._8_4_ = fVar106 * fVar11;
            auVar36._12_4_ = fVar107 * fVar12;
            auVar36._16_4_ = fVar108 * fVar13;
            auVar36._20_4_ = fVar109 * fVar14;
            auVar36._24_4_ = fVar110 * fVar15;
            auVar36._28_4_ = auVar59._28_4_;
            auVar65 = vfmadd213ps_fma(local_fe0,local_12a0,auVar36);
            auVar94 = vfmadd213ps_fma(local_13e0,local_12c0,ZEXT1632(auVar65));
            auVar59 = vrcpps_avx(auVar82);
            auVar137._8_4_ = 0x3f800000;
            auVar137._0_8_ = 0x3f8000003f800000;
            auVar137._12_4_ = 0x3f800000;
            auVar137._16_4_ = 0x3f800000;
            auVar137._20_4_ = 0x3f800000;
            auVar137._24_4_ = 0x3f800000;
            auVar137._28_4_ = 0x3f800000;
            auVar65 = vfnmadd213ps_fma(auVar59,auVar82,auVar137);
            auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar59,auVar59);
            local_1200 = ZEXT1632(CONCAT412((auVar94._12_4_ + auVar94._12_4_) * auVar65._12_4_,
                                            CONCAT48((auVar94._8_4_ + auVar94._8_4_) * auVar65._8_4_
                                                     ,CONCAT44((auVar94._4_4_ + auVar94._4_4_) *
                                                               auVar65._4_4_,
                                                               (auVar94._0_4_ + auVar94._0_4_) *
                                                               auVar65._0_4_))));
            auVar62 = ZEXT3264(local_1200);
            uVar41 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar90._4_4_ = uVar41;
            auVar90._0_4_ = uVar41;
            auVar90._8_4_ = uVar41;
            auVar90._12_4_ = uVar41;
            auVar90._16_4_ = uVar41;
            auVar90._20_4_ = uVar41;
            auVar90._24_4_ = uVar41;
            auVar90._28_4_ = uVar41;
            auVar59 = vcmpps_avx(auVar90,local_1200,2);
            fVar92 = (ray->super_RayK<1>).tfar;
            auVar129._4_4_ = fVar92;
            auVar129._0_4_ = fVar92;
            auVar129._8_4_ = fVar92;
            auVar129._12_4_ = fVar92;
            auVar129._16_4_ = fVar92;
            auVar129._20_4_ = fVar92;
            auVar129._24_4_ = fVar92;
            auVar129._28_4_ = fVar92;
            auVar60 = vcmpps_avx(local_1200,auVar129,2);
            auVar59 = vandps_avx(auVar60,auVar59);
            auVar130._0_8_ = CONCAT44(fVar83,fVar74) ^ 0x8000000080000000;
            auVar130._8_4_ = -fVar84;
            auVar130._12_4_ = -fVar85;
            auVar130._16_4_ = 0x80000000;
            auVar130._20_4_ = 0x80000000;
            auVar130._24_4_ = 0x80000000;
            auVar130._28_4_ = 0x80000000;
            auVar60 = vcmpps_avx(auVar130,auVar82,4);
            auVar59 = vandps_avx(auVar59,auVar60);
            auVar65 = vpackssdw_avx(auVar59._0_16_,auVar59._16_16_);
            auVar63 = vpand_avx(auVar65,auVar63);
            local_1260 = vpmovsxwd_avx2(auVar63);
            if ((((((((local_1260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_1260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_1260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_1260 >> 0x7f,0) != '\0') ||
                  (local_1260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_1260 >> 0xbf,0) != '\0') ||
                (local_1260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_1260[0x1f] < '\0') {
              uStack_1310 = 0;
              uStack_130c = 0;
              uStack_1308 = 0;
              uStack_1304 = 0;
              local_1300 = local_10e0;
              auVar59 = vrcpps_avx(local_12e0);
              auVar131._8_4_ = 0x3f800000;
              auVar131._0_8_ = 0x3f8000003f800000;
              auVar131._12_4_ = 0x3f800000;
              auVar131._16_4_ = 0x3f800000;
              auVar131._20_4_ = 0x3f800000;
              auVar131._24_4_ = 0x3f800000;
              auVar131._28_4_ = 0x3f800000;
              auVar65 = vfnmadd213ps_fma(local_12e0,auVar59,auVar131);
              auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar59,auVar59);
              auVar91._8_4_ = 0x219392ef;
              auVar91._0_8_ = 0x219392ef219392ef;
              auVar91._12_4_ = 0x219392ef;
              auVar91._16_4_ = 0x219392ef;
              auVar91._20_4_ = 0x219392ef;
              auVar91._24_4_ = 0x219392ef;
              auVar91._28_4_ = 0x219392ef;
              auVar59 = vcmpps_avx(local_1100,auVar91,5);
              auVar59 = vandps_avx(auVar59,ZEXT1632(auVar65));
              local_1180 = local_1140;
              auVar37._4_4_ = local_1320._4_4_ * auVar59._4_4_;
              auVar37._0_4_ = local_1320._0_4_ * auVar59._0_4_;
              auVar37._8_4_ = local_1320._8_4_ * auVar59._8_4_;
              auVar37._12_4_ = local_1320._12_4_ * auVar59._12_4_;
              auVar37._16_4_ = auVar59._16_4_ * 0.0;
              auVar37._20_4_ = auVar59._20_4_ * 0.0;
              auVar37._24_4_ = auVar59._24_4_ * 0.0;
              auVar37._28_4_ = 0;
              auVar60 = vminps_avx(auVar37,auVar131);
              auVar38._4_4_ = auVar100._4_4_ * auVar59._4_4_;
              auVar38._0_4_ = auVar100._0_4_ * auVar59._0_4_;
              auVar38._8_4_ = auVar100._8_4_ * auVar59._8_4_;
              auVar38._12_4_ = auVar100._12_4_ * auVar59._12_4_;
              auVar38._16_4_ = auVar59._16_4_ * 0.0;
              auVar38._20_4_ = auVar59._20_4_ * 0.0;
              auVar38._24_4_ = auVar59._24_4_ * 0.0;
              auVar38._28_4_ = 0;
              auVar59 = vminps_avx(auVar38,auVar131);
              auVar82 = vsubps_avx(auVar131,auVar60);
              local_1220 = vblendvps_avx(auVar59,auVar82,local_1140);
              auVar59 = vsubps_avx(auVar131,auVar59);
              local_1240 = vblendvps_avx(auVar60,auVar59,local_1140);
              local_11e0[0] = local_12c0._0_4_ * (float)local_1160._0_4_;
              local_11e0[1] = local_12c0._4_4_ * (float)local_1160._4_4_;
              local_11e0[2] = local_12c0._8_4_ * fStack_1158;
              local_11e0[3] = local_12c0._12_4_ * fStack_1154;
              fStack_11d0 = local_12c0._16_4_ * fStack_1150;
              fStack_11cc = local_12c0._20_4_ * fStack_114c;
              fStack_11c8 = local_12c0._24_4_ * fStack_1148;
              uStack_11c4 = local_1240._28_4_;
              local_11c0[0] = (float)local_1160._0_4_ * local_12a0._0_4_;
              local_11c0[1] = (float)local_1160._4_4_ * local_12a0._4_4_;
              local_11c0[2] = fStack_1158 * local_12a0._8_4_;
              local_11c0[3] = fStack_1154 * local_12a0._12_4_;
              fStack_11b0 = fStack_1150 * local_12a0._16_4_;
              fStack_11ac = fStack_114c * local_12a0._20_4_;
              fStack_11a8 = fStack_1148 * local_12a0._24_4_;
              uStack_11a4 = auVar59._28_4_;
              auVar59 = vpmovzxwd_avx2(auVar63);
              auVar59 = vpslld_avx2(auVar59,0x1f);
              auVar73._8_4_ = 0x7f800000;
              auVar73._0_8_ = 0x7f8000007f800000;
              auVar73._12_4_ = 0x7f800000;
              auVar73._16_4_ = 0x7f800000;
              auVar73._20_4_ = 0x7f800000;
              auVar73._24_4_ = 0x7f800000;
              auVar73._28_4_ = 0x7f800000;
              auVar59 = vblendvps_avx(auVar73,local_1200,auVar59);
              local_11a0[0] = (float)local_1160._0_4_ * fVar93;
              local_11a0[1] = (float)local_1160._4_4_ * fVar105;
              local_11a0[2] = fStack_1158 * fVar106;
              local_11a0[3] = fStack_1154 * fVar107;
              fStack_1190 = fStack_1150 * fVar108;
              fStack_118c = fStack_114c * fVar109;
              fStack_1188 = fStack_1148 * fVar110;
              uStack_1184 = uStack_1144;
              auVar60 = vshufps_avx(auVar59,auVar59,0xb1);
              auVar60 = vminps_avx(auVar59,auVar60);
              auVar82 = vshufpd_avx(auVar60,auVar60,5);
              auVar60 = vminps_avx(auVar60,auVar82);
              auVar82 = vpermpd_avx2(auVar60,0x4e);
              auVar60 = vminps_avx(auVar60,auVar82);
              auVar59 = vcmpps_avx(auVar59,auVar60,0);
              auVar100 = vpackssdw_avx(auVar59._0_16_,auVar59._16_16_);
              auVar100 = vpand_avx(auVar100,auVar63);
              auVar59 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              auVar135 = ZEXT3264(auVar59);
              local_1400 = local_1260;
              auVar60 = vpmovzxwd_avx2(auVar100);
              auVar60 = vpslld_avx2(auVar60,0x1f);
              if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar60 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar60 >> 0x7f,0) == '\0') &&
                    (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar60 >> 0xbf,0) == '\0') &&
                  (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar60[0x1f]) {
                auVar60 = local_1260;
              }
              uVar45 = vextractps_avx(auVar59._0_16_,1);
              uVar46 = vmovmskps_avx(auVar60);
              uVar47 = 0;
              for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x80000000) {
                uVar47 = uVar47 + 1;
              }
              do {
                uVar53 = (ulong)uVar47;
                local_1418 = *(uint *)((long)&local_fc0 + uVar53 * 4);
                pGVar9 = (pSVar3->geometries).items[local_1418].ptr;
                if ((pGVar9->mask & uVar45) == 0) {
                  *(undefined4 *)(local_1400 + uVar53 * 4) = 0;
                }
                else {
                  local_1460._0_8_ = context->args;
                  local_1480 = auVar135._0_32_;
                  if (context->args->filter == (RTCFilterFunctionN)0x0) {
                    local_14b0.context = context->user;
                    if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      fVar92 = *(float *)(local_1240 + uVar53 * 4);
                      fVar10 = *(float *)(local_1220 + uVar53 * 4);
                      (ray->super_RayK<1>).tfar = local_11e0[uVar53 - 8];
                      (ray->Ng).field_0.field_0.x = local_11e0[uVar53];
                      (ray->Ng).field_0.field_0.y = local_11c0[uVar53];
                      (ray->Ng).field_0.field_0.z = local_11a0[uVar53];
                      ray->u = fVar92;
                      ray->v = fVar10;
                      ray->primID = *(uint *)((long)&local_1340 + uVar53 * 4);
                      ray->geomID = local_1418;
                      ray->instID[0] = (local_14b0.context)->instID[0];
                      ray->instPrimID[0] = (local_14b0.context)->instPrimID[0];
                      uVar53 = local_14e8;
                      break;
                    }
                  }
                  else {
                    local_14b0.context = context->user;
                  }
                  local_1430 = local_11e0[uVar53];
                  local_142c = local_11c0[uVar53];
                  local_1428 = local_11a0[uVar53];
                  local_1424 = *(undefined4 *)(local_1240 + uVar53 * 4);
                  local_1420 = *(undefined4 *)(local_1220 + uVar53 * 4);
                  local_141c = *(undefined4 *)((long)&local_1340 + uVar53 * 4);
                  local_1414 = (local_14b0.context)->instID[0];
                  local_1410 = (local_14b0.context)->instPrimID[0];
                  (ray->super_RayK<1>).tfar = local_11e0[uVar53 - 8];
                  local_150c = -1;
                  local_14b0.valid = &local_150c;
                  local_14b0.geometryUserPtr = pGVar9->userPtr;
                  local_14b0.ray = (RTCRayN *)ray;
                  local_14b0.hit = (RTCHitN *)&local_1430;
                  local_14b0.N = 1;
                  local_14e0 = (long)pGVar9;
                  local_13e0 = auVar62._0_32_;
                  if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_014a37cd:
                    if ((*(code **)(local_1460._0_8_ + 0x10) != (code *)0x0) &&
                       (((*(byte *)local_1460._0_8_ & 2) != 0 ||
                        ((*(byte *)(local_14e0 + 0x3e) & 0x40) != 0)))) {
                      (**(code **)(local_1460._0_8_ + 0x10))(&local_14b0);
                      auVar62 = ZEXT3264(local_13e0);
                      context = local_14f0;
                      ray = local_14f8;
                      uVar50 = local_1500;
                      uVar51 = local_1508;
                      if (*local_14b0.valid == 0) goto LAB_014a388b;
                    }
                    (((Vec3f *)((long)local_14b0.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_14b0.hit;
                    (((Vec3f *)((long)local_14b0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_14b0.hit + 4);
                    (((Vec3f *)((long)local_14b0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_14b0.hit + 8);
                    *(float *)((long)local_14b0.ray + 0x3c) = *(float *)(local_14b0.hit + 0xc);
                    *(float *)((long)local_14b0.ray + 0x40) = *(float *)(local_14b0.hit + 0x10);
                    *(float *)((long)local_14b0.ray + 0x44) = *(float *)(local_14b0.hit + 0x14);
                    *(float *)((long)local_14b0.ray + 0x48) = *(float *)(local_14b0.hit + 0x18);
                    *(float *)((long)local_14b0.ray + 0x4c) = *(float *)(local_14b0.hit + 0x1c);
                    *(float *)((long)local_14b0.ray + 0x50) = *(float *)(local_14b0.hit + 0x20);
                  }
                  else {
                    (*pGVar9->intersectionFilterN)(&local_14b0);
                    auVar62 = ZEXT3264(local_13e0);
                    context = local_14f0;
                    ray = local_14f8;
                    uVar50 = local_1500;
                    uVar51 = local_1508;
                    if (*local_14b0.valid != 0) goto LAB_014a37cd;
LAB_014a388b:
                    (local_14f8->super_RayK<1>).tfar = (float)local_1480._0_4_;
                    context = local_14f0;
                    ray = local_14f8;
                    uVar50 = local_1500;
                    uVar51 = local_1508;
                  }
                  *(undefined4 *)(local_1400 + uVar53 * 4) = 0;
                  fVar92 = (ray->super_RayK<1>).tfar;
                  auVar61._4_4_ = fVar92;
                  auVar61._0_4_ = fVar92;
                  auVar61._8_4_ = fVar92;
                  auVar61._12_4_ = fVar92;
                  auVar61._16_4_ = fVar92;
                  auVar61._20_4_ = fVar92;
                  auVar61._24_4_ = fVar92;
                  auVar61._28_4_ = fVar92;
                  auVar59 = vcmpps_avx(auVar62._0_32_,auVar61,2);
                  local_1400 = vandps_avx(auVar59,local_1400);
                  uVar45 = (ray->super_RayK<1>).mask;
                  auVar135 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
                }
                uVar53 = local_14e8;
                if ((((((((local_1400 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1400 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1400 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1400 >> 0x7f,0) == '\0') &&
                      (local_1400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_1400 >> 0xbf,0) == '\0') &&
                    (local_1400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_1400[0x1f]) break;
                auVar68._8_4_ = 0x7f800000;
                auVar68._0_8_ = 0x7f8000007f800000;
                auVar68._12_4_ = 0x7f800000;
                auVar68._16_4_ = 0x7f800000;
                auVar68._20_4_ = 0x7f800000;
                auVar68._24_4_ = 0x7f800000;
                auVar68._28_4_ = 0x7f800000;
                auVar59 = vblendvps_avx(auVar68,auVar62._0_32_,local_1400);
                auVar60 = vshufps_avx(auVar59,auVar59,0xb1);
                auVar60 = vminps_avx(auVar59,auVar60);
                auVar82 = vshufpd_avx(auVar60,auVar60,5);
                auVar60 = vminps_avx(auVar60,auVar82);
                auVar82 = vpermpd_avx2(auVar60,0x4e);
                auVar60 = vminps_avx(auVar60,auVar82);
                auVar60 = vcmpps_avx(auVar59,auVar60,0);
                auVar82 = local_1400 & auVar60;
                auVar59 = local_1400;
                if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar82 >> 0x7f,0) != '\0') ||
                      (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar82 >> 0xbf,0) != '\0') ||
                    (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar82[0x1f] < '\0') {
                  auVar59 = vandps_avx(auVar60,local_1400);
                }
                uVar46 = vmovmskps_avx(auVar59);
                uVar47 = 0;
                for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x80000000) {
                  uVar47 = uVar47 + 1;
                }
              } while( true );
            }
          }
          auVar135 = ZEXT1664(local_1350);
          auVar138 = ZEXT1664(local_1360);
          auVar139 = ZEXT1664(local_1370);
          auVar140 = ZEXT1664(local_1380);
          auVar142 = ZEXT1664(local_1390);
          auVar144 = ZEXT1664(local_13a0);
          auVar152 = ZEXT1664(local_13b0);
        }
        fVar92 = (ray->super_RayK<1>).tfar;
        auVar62 = ZEXT1664(CONCAT412(fVar92,CONCAT48(fVar92,CONCAT44(fVar92,fVar92))));
      }
      goto LAB_014a2bc2;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }